

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O0

int tls_cbc_digest_record_sha1
              (uint8_t *md_out,size_t *md_out_size,uint8_t *header,uint8_t *data,size_t data_size,
              size_t data_plus_mac_plus_padding_size,uint8_t *mac_secret,uint mac_secret_length)

{
  int iVar1;
  ulong local_120;
  size_t i_1;
  uint8_t mac_out [20];
  size_t local_f8;
  size_t min_data_size;
  SHA_CTX ctx;
  size_t i;
  uint8_t hmac_pad [64];
  size_t data_plus_mac_plus_padding_size_local;
  size_t data_size_local;
  uint8_t *data_local;
  uint8_t *header_local;
  size_t *md_out_size_local;
  uint8_t *md_out_local;
  
  if (0x40 < mac_secret_length) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                  ,0x158,
                  "int tls_cbc_digest_record_sha1(uint8_t *, size_t *, const uint8_t *, const uint8_t *, size_t, size_t, const uint8_t *, unsigned int)"
                 );
  }
  OPENSSL_memset(&i,0,0x40);
  OPENSSL_memcpy(&i,mac_secret,(ulong)mac_secret_length);
  ctx.data[0x3c] = '\0';
  ctx.data[0x3d] = '\0';
  ctx.data[0x3e] = '\0';
  ctx.data[0x3f] = '\0';
  ctx.num = 0;
  for (; (ulong)ctx._88_8_ < 0x40; ctx._88_8_ = ctx._88_8_ + 1) {
    hmac_pad[ctx._88_8_ + -8] = hmac_pad[ctx._88_8_ + -8] ^ 0x36;
  }
  SHA1_Init((SHA_CTX *)&min_data_size);
  SHA1_Update((SHA_CTX *)&min_data_size,&i,0x40);
  SHA1_Update((SHA_CTX *)&min_data_size,header,0xd);
  local_f8 = 0;
  if (0x114 < data_plus_mac_plus_padding_size) {
    local_f8 = data_plus_mac_plus_padding_size - 0x114;
  }
  SHA1_Update((SHA_CTX *)&min_data_size,data,local_f8);
  iVar1 = EVP_sha1_final_with_secret_suffix
                    ((SHA_CTX *)&min_data_size,(uint8_t *)&i_1,data + local_f8,data_size - local_f8,
                     data_plus_mac_plus_padding_size - local_f8);
  if (iVar1 == 0) {
    md_out_local._4_4_ = 0;
  }
  else {
    SHA1_Init((SHA_CTX *)&min_data_size);
    for (local_120 = 0; local_120 < 0x40; local_120 = local_120 + 1) {
      hmac_pad[local_120 - 8] = hmac_pad[local_120 - 8] ^ 0x6a;
    }
    SHA1_Update((SHA_CTX *)&min_data_size,&i,0x40);
    SHA1_Update((SHA_CTX *)&min_data_size,&i_1,0x14);
    SHA1_Final(md_out,(SHA_CTX *)&min_data_size);
    *md_out_size = 0x14;
    md_out_local._4_4_ = 1;
  }
  return md_out_local._4_4_;
}

Assistant:

static int tls_cbc_digest_record_sha1(uint8_t *md_out, size_t *md_out_size,
                                      const uint8_t header[13],
                                      const uint8_t *data, size_t data_size,
                                      size_t data_plus_mac_plus_padding_size,
                                      const uint8_t *mac_secret,
                                      unsigned mac_secret_length) {
  if (mac_secret_length > SHA_CBLOCK) {
    // HMAC pads small keys with zeros and hashes large keys down. This function
    // should never reach the large key case.
    assert(0);
    return 0;
  }

  // Compute the initial HMAC block.
  uint8_t hmac_pad[SHA_CBLOCK];
  OPENSSL_memset(hmac_pad, 0, sizeof(hmac_pad));
  OPENSSL_memcpy(hmac_pad, mac_secret, mac_secret_length);
  for (size_t i = 0; i < SHA_CBLOCK; i++) {
    hmac_pad[i] ^= 0x36;
  }

  SHA_CTX ctx;
  SHA1_Init(&ctx);
  SHA1_Update(&ctx, hmac_pad, SHA_CBLOCK);
  SHA1_Update(&ctx, header, 13);

  // There are at most 256 bytes of padding, so we can compute the public
  // minimum length for |data_size|.
  size_t min_data_size = 0;
  if (data_plus_mac_plus_padding_size > SHA_DIGEST_LENGTH + 256) {
    min_data_size = data_plus_mac_plus_padding_size - SHA_DIGEST_LENGTH - 256;
  }

  // Hash the public minimum length directly. This reduces the number of blocks
  // that must be computed in constant-time.
  SHA1_Update(&ctx, data, min_data_size);

  // Hash the remaining data without leaking |data_size|.
  uint8_t mac_out[SHA_DIGEST_LENGTH];
  if (!EVP_sha1_final_with_secret_suffix(
          &ctx, mac_out, data + min_data_size, data_size - min_data_size,
          data_plus_mac_plus_padding_size - min_data_size)) {
    return 0;
  }

  // Complete the HMAC in the standard manner.
  SHA1_Init(&ctx);
  for (size_t i = 0; i < SHA_CBLOCK; i++) {
    hmac_pad[i] ^= 0x6a;
  }

  SHA1_Update(&ctx, hmac_pad, SHA_CBLOCK);
  SHA1_Update(&ctx, mac_out, SHA_DIGEST_LENGTH);
  SHA1_Final(md_out, &ctx);
  *md_out_size = SHA_DIGEST_LENGTH;
  return 1;
}